

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_logger-inl.h
# Opt level: O0

void __thiscall spdlog::async_logger::sink_it_(async_logger *this,log_msg *msg)

{
  bool bVar1;
  shared_ptr<spdlog::details::thread_pool> pool_ptr;
  async_overflow_policy in_stack_0000012c;
  log_msg *in_stack_00000130;
  async_logger_ptr *in_stack_00000138;
  thread_pool *in_stack_00000140;
  enable_shared_from_this<spdlog::async_logger> *in_stack_ffffffffffffff78;
  weak_ptr<spdlog::details::thread_pool> *in_stack_ffffffffffffff88;
  allocator<char> local_61;
  string local_60 [16];
  allocator<char> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  string *in_stack_ffffffffffffffc0;
  __shared_ptr local_20 [32];
  
  std::weak_ptr<spdlog::details::thread_pool>::lock(in_stack_ffffffffffffff88);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_20);
  if (bVar1) {
    std::__shared_ptr_access<spdlog::details::thread_pool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<spdlog::details::thread_pool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x153fbf);
    std::enable_shared_from_this<spdlog::async_logger>::shared_from_this(in_stack_ffffffffffffff78);
    details::thread_pool::post_log
              (in_stack_00000140,in_stack_00000138,in_stack_00000130,in_stack_0000012c);
    std::shared_ptr<spdlog::async_logger>::~shared_ptr((shared_ptr<spdlog::async_logger> *)0x154007)
    ;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    throw_spdlog_ex(in_stack_ffffffffffffffc0);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator(&local_61);
  }
  std::shared_ptr<spdlog::details::thread_pool>::~shared_ptr
            ((shared_ptr<spdlog::details::thread_pool> *)0x1540c3);
  return;
}

Assistant:

SPDLOG_INLINE void spdlog::async_logger::sink_it_(const details::log_msg &msg)
{
    if (auto pool_ptr = thread_pool_.lock())
    {
        pool_ptr->post_log(shared_from_this(), msg, overflow_policy_);
    }
    else
    {
        throw_spdlog_ex("async log: thread pool doesn't exist anymore");
    }
}